

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall
SkylineBinPack::AddSkylineLevel(SkylineBinPack *this,int skylineNodeIndex,Rect *rect)

{
  int iVar1;
  uint index;
  uint uVar2;
  int iVar3;
  SkylineNode *pSVar4;
  int shrink;
  uint i;
  SkylineNode newNode;
  Rect *rect_local;
  int skylineNodeIndex_local;
  SkylineBinPack *this_local;
  
  newNode._4_8_ = rect;
  if ((this->useWasteMap & 1U) != 0) {
    AddWasteMapArea(this,skylineNodeIndex,rect->width,rect->height,rect->y);
  }
  shrink = *(int *)newNode._4_8_;
  i = *(int *)(newNode._4_8_ + 4) + *(int *)(newNode._4_8_ + 0xc);
  newNode.x = *(int *)(newNode._4_8_ + 8);
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Insert
            (&this->skyLine,skylineNodeIndex,(SkylineNode *)&shrink);
  if (this->binWidth < shrink + newNode.x) {
    __assert_fail("newNode.x + newNode.width <= binWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe1,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  if (this->binHeight < (int)i) {
    __assert_fail("newNode.y <= binHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe2,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  index = skylineNodeIndex + 1;
  while (uVar2 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size
                           (&this->skyLine), index < uVar2) {
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(uint)skylineNodeIndex);
    iVar3 = pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    if (pSVar4->x < iVar3) {
      __assert_fail("skyLine[i-1].x <= skyLine[i].x",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xe6,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
    }
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    iVar3 = pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(uint)skylineNodeIndex);
    iVar1 = pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(uint)skylineNodeIndex);
    if (iVar1 + pSVar4->width <= iVar3) break;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(uint)skylineNodeIndex);
    iVar3 = pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(uint)skylineNodeIndex);
    iVar1 = pSVar4->width;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    iVar3 = (iVar3 + iVar1) - pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    pSVar4->x = iVar3 + pSVar4->x;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    pSVar4->width = pSVar4->width - iVar3;
    pSVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)index);
    if (0 < pSVar4->width) break;
    TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Delete(&this->skyLine,index);
  }
  MergeSkylines(this);
  return;
}

Assistant:

void SkylineBinPack::AddSkylineLevel(int skylineNodeIndex, const Rect &rect)
{
	// First track all wasted areas and mark them into the waste map if we're using one.
	if (useWasteMap)
		AddWasteMapArea(skylineNodeIndex, rect.width, rect.height, rect.y);

	SkylineNode newNode;
	newNode.x = rect.x;
	newNode.y = rect.y + rect.height;
	newNode.width = rect.width;
	skyLine.Insert(skylineNodeIndex, newNode);

	assert(newNode.x + newNode.width <= binWidth);
	assert(newNode.y <= binHeight);

	for(unsigned i = skylineNodeIndex+1; i < skyLine.Size(); ++i)
	{
		assert(skyLine[i-1].x <= skyLine[i].x);

		if (skyLine[i].x < skyLine[i-1].x + skyLine[i-1].width)
		{
			int shrink = skyLine[i-1].x + skyLine[i-1].width - skyLine[i].x;

			skyLine[i].x += shrink;
			skyLine[i].width -= shrink;

			if (skyLine[i].width <= 0)
			{
				skyLine.Delete(i);
				--i;
			}
			else
				break;
		}
		else
			break;
	}
	MergeSkylines();
}